

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::PReLU_x86_fma::forward_inplace(PReLU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  uint *puVar2;
  void *pvVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  float *ptr;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [32];
  uint uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  auVar4 = _DAT_005f08a0;
  auVar23 = _DAT_005f0880;
  auVar22 = in_ZMM5._0_16_;
  iVar14 = bottom_top_blob->elempack;
  iVar9 = bottom_top_blob->dims;
  iVar15 = bottom_top_blob->w;
  uVar19 = bottom_top_blob->h;
  uVar13 = bottom_top_blob->c;
  if (iVar9 == 3) {
    if (0 < (int)uVar13) {
      uVar19 = iVar15 * iVar14 * uVar19;
      auVar36 = ZEXT816(0) << 0x40;
      auVar26._8_8_ = 0x8000000000000000;
      auVar26._0_8_ = 0x8000000000000000;
      auVar22 = vpcmpeqd_avx(auVar22,auVar22);
      auVar29._8_4_ = 0xffff;
      auVar29._0_8_ = 0xffff0000ffff;
      auVar29._12_4_ = 0xffff;
      auVar29._16_4_ = 0xffff;
      auVar29._20_4_ = 0xffff;
      auVar29._24_4_ = 0xffff;
      auVar29._28_4_ = 0xffff;
      uVar20 = 0;
      do {
        iVar9 = (this->super_PReLU).num_slope;
        uVar8 = uVar20 & 0xffffffff;
        if (iVar9 < 2) {
          uVar8 = 0;
        }
        uVar1 = *(uint *)((long)(this->super_PReLU).slope_data.data + uVar8 * 4);
        if (iVar9 < 2 || iVar14 != 4) {
          auVar25 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
        }
        else {
          auVar25 = *(undefined1 (*) [16])
                     ((long)(this->super_PReLU).slope_data.data + uVar20 * 0x10);
        }
        if (iVar14 == 8 && 1 < iVar9) {
          auVar35 = *(undefined1 (*) [32])
                     ((long)(this->super_PReLU).slope_data.data + uVar20 * 0x20);
        }
        else {
          auVar35._16_16_ = auVar25;
          auVar35._0_16_ = auVar25;
        }
        pauVar18 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar20 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = 0;
        if (7 < (int)uVar19) {
          iVar9 = 7;
          do {
            auVar33 = vmaxps_avx(*pauVar18,ZEXT1632(auVar36));
            auVar5 = vminps_avx(*pauVar18,ZEXT1632(auVar36));
            auVar24 = vfmadd213ps_fma(auVar5,auVar35,auVar33);
            *pauVar18 = ZEXT1632(auVar24);
            pauVar18 = pauVar18 + 1;
            iVar9 = iVar9 + 8;
            uVar10 = uVar19 & 0xfffffff8;
          } while (iVar9 < (int)uVar19);
        }
        uVar12 = uVar10 | 3;
        while ((int)uVar12 < (int)uVar19) {
          auVar24 = vmaxps_avx(*(undefined1 (*) [16])*pauVar18,ZEXT816(0) << 0x40);
          auVar27 = vminps_avx(*(undefined1 (*) [16])*pauVar18,ZEXT816(0) << 0x40);
          auVar24 = vfmadd213ps_fma(auVar27,auVar25,auVar24);
          *(undefined1 (*) [16])*pauVar18 = auVar24;
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
          uVar12 = uVar10 + 7;
          uVar10 = uVar10 + 4;
        }
        if ((int)uVar10 < (int)uVar19) {
          uVar8 = CONCAT44(0,~uVar10 + uVar19);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar8;
          auVar27 = vpshufd_avx(auVar32,0x44);
          auVar30 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
          auVar25 = vorps_avx(auVar27,auVar26);
          auVar24 = vorps_avx(auVar27,auVar26);
          uVar11 = 0;
          do {
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar11;
            auVar44 = vpshufd_avx(auVar42,0x44);
            auVar48._16_16_ = auVar44;
            auVar48._0_16_ = auVar44;
            auVar33 = vorps_avx(auVar48,auVar23);
            auVar5 = vorps_avx(auVar48,auVar4);
            auVar44 = vorps_avx(auVar27,auVar26);
            auVar59._0_8_ = auVar5._16_8_ ^ 0x8000000000000000;
            auVar59._8_4_ = auVar5._24_4_;
            auVar59._12_4_ = auVar5._28_4_ ^ 0x80000000;
            auVar41 = vpcmpgtq_avx(auVar59,auVar44);
            auVar43._0_8_ = auVar5._0_8_ ^ 0x8000000000000000;
            auVar43._8_4_ = auVar5._8_4_;
            auVar43._12_4_ = auVar5._12_4_ ^ 0x80000000;
            auVar56 = vpcmpgtq_avx(auVar43,auVar25);
            auVar41 = vpackssdw_avx(auVar56,auVar41);
            auVar60._0_8_ = auVar33._16_8_ ^ 0x8000000000000000;
            auVar60._8_4_ = auVar33._24_4_;
            auVar60._12_4_ = auVar33._28_4_ ^ 0x80000000;
            auVar44 = vpcmpgtq_avx(auVar60,auVar44);
            auVar53._0_8_ = auVar33._0_8_ ^ 0x8000000000000000;
            auVar53._8_4_ = auVar33._8_4_;
            auVar53._12_4_ = auVar33._12_4_ ^ 0x80000000;
            auVar56 = vpcmpgtq_avx(auVar53,auVar24);
            auVar44 = vpackssdw_avx(auVar56,auVar44);
            auVar44 = vpackssdw_avx(auVar44 ^ auVar22,auVar41 ^ auVar22);
            auVar41 = vpmovsxwd_avx(auVar44);
            auVar56 = vpunpckhwd_avx(auVar44,auVar44);
            auVar55._16_16_ = auVar56;
            auVar55._0_16_ = auVar41;
            auVar5 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])(*pauVar18 + uVar11 * 4));
            auVar33 = vcmpps_avx(auVar5,ZEXT1632(auVar36),1);
            auVar33 = vandps_avx(auVar33,auVar29);
            auVar41 = vpackusdw_avx(auVar33._0_16_,auVar33._16_16_);
            auVar44 = vpand_avx(auVar44,auVar41);
            auVar41 = vpmovzxwd_avx(auVar44);
            auVar41 = vpslld_avx(auVar41,0x1f);
            auVar44 = vpunpckhwd_avx(auVar44,auVar44);
            auVar44 = vpslld_avx(auVar44,0x1f);
            auVar49._16_16_ = auVar44;
            auVar49._0_16_ = auVar41;
            auVar7._4_4_ = auVar5._4_4_ * auVar30._4_4_;
            auVar7._0_4_ = auVar5._0_4_ * auVar30._0_4_;
            auVar7._8_4_ = auVar5._8_4_ * auVar30._8_4_;
            auVar7._12_4_ = auVar5._12_4_ * auVar30._12_4_;
            auVar7._16_4_ = auVar5._16_4_ * auVar30._0_4_;
            auVar7._20_4_ = auVar5._20_4_ * auVar30._4_4_;
            auVar7._24_4_ = auVar5._24_4_ * auVar30._8_4_;
            auVar7._28_4_ = auVar5._28_4_;
            auVar33 = vmaskmovps_avx(auVar49,auVar7);
            *(undefined1 (*) [32])(*pauVar18 + uVar11 * 4) = auVar33;
            uVar11 = uVar11 + 8;
          } while ((uVar8 + 8 & 0x1fffffff8) != uVar11);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar13);
    }
  }
  else if (iVar9 == 2) {
    if (0 < (int)uVar19) {
      uVar13 = iVar14 * iVar15;
      auVar36 = ZEXT816(0) << 0x40;
      auVar25._8_8_ = 0x8000000000000000;
      auVar25._0_8_ = 0x8000000000000000;
      auVar22 = vpcmpeqd_avx(auVar22,auVar22);
      auVar28._8_4_ = 0xffff;
      auVar28._0_8_ = 0xffff0000ffff;
      auVar28._12_4_ = 0xffff;
      auVar28._16_4_ = 0xffff;
      auVar28._20_4_ = 0xffff;
      auVar28._24_4_ = 0xffff;
      auVar28._28_4_ = 0xffff;
      uVar20 = 0;
      do {
        iVar9 = (this->super_PReLU).num_slope;
        uVar8 = uVar20 & 0xffffffff;
        if (iVar9 < 2) {
          uVar8 = 0;
        }
        uVar1 = *(uint *)((long)(this->super_PReLU).slope_data.data + uVar8 * 4);
        if (iVar9 < 2 || iVar14 != 4) {
          auVar24 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
        }
        else {
          auVar24 = *(undefined1 (*) [16])
                     ((long)(this->super_PReLU).slope_data.data + uVar20 * 0x10);
        }
        if (iVar14 == 8 && 1 < iVar9) {
          auVar34 = *(undefined1 (*) [32])
                     ((long)(this->super_PReLU).slope_data.data + uVar20 * 0x20);
        }
        else {
          auVar34._16_16_ = auVar24;
          auVar34._0_16_ = auVar24;
        }
        pauVar18 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar20 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = 0;
        if (7 < (int)uVar13) {
          iVar9 = 7;
          do {
            auVar33 = vmaxps_avx(*pauVar18,ZEXT1632(auVar36));
            auVar5 = vminps_avx(*pauVar18,ZEXT1632(auVar36));
            auVar27 = vfmadd213ps_fma(auVar5,auVar34,auVar33);
            *pauVar18 = ZEXT1632(auVar27);
            pauVar18 = pauVar18 + 1;
            iVar9 = iVar9 + 8;
            uVar10 = uVar13 & 0xfffffff8;
          } while (iVar9 < (int)uVar13);
        }
        uVar12 = uVar10 | 3;
        while ((int)uVar12 < (int)uVar13) {
          auVar27 = vmaxps_avx(*(undefined1 (*) [16])*pauVar18,ZEXT816(0) << 0x40);
          auVar30 = vminps_avx(*(undefined1 (*) [16])*pauVar18,ZEXT816(0) << 0x40);
          auVar27 = vfmadd213ps_fma(auVar30,auVar24,auVar27);
          *(undefined1 (*) [16])*pauVar18 = auVar27;
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
          uVar12 = uVar10 + 7;
          uVar10 = uVar10 + 4;
        }
        if ((int)uVar10 < (int)uVar13) {
          uVar8 = CONCAT44(0,~uVar10 + uVar13);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar8;
          auVar30 = vpshufd_avx(auVar31,0x44);
          auVar44 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
          auVar24 = vorps_avx(auVar30,auVar25);
          auVar27 = vorps_avx(auVar30,auVar25);
          uVar11 = 0;
          do {
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar11;
            auVar41 = vpshufd_avx(auVar39,0x44);
            auVar46._16_16_ = auVar41;
            auVar46._0_16_ = auVar41;
            auVar33 = vorps_avx(auVar46,auVar23);
            auVar5 = vorps_avx(auVar46,auVar4);
            auVar41 = vorps_avx(auVar30,auVar25);
            auVar57._0_8_ = auVar5._16_8_ ^ 0x8000000000000000;
            auVar57._8_4_ = auVar5._24_4_;
            auVar57._12_4_ = auVar5._28_4_ ^ 0x80000000;
            auVar56 = vpcmpgtq_avx(auVar57,auVar41);
            auVar40._0_8_ = auVar5._0_8_ ^ 0x8000000000000000;
            auVar40._8_4_ = auVar5._8_4_;
            auVar40._12_4_ = auVar5._12_4_ ^ 0x80000000;
            auVar50 = vpcmpgtq_avx(auVar40,auVar24);
            auVar56 = vpackssdw_avx(auVar50,auVar56);
            auVar58._0_8_ = auVar33._16_8_ ^ 0x8000000000000000;
            auVar58._8_4_ = auVar33._24_4_;
            auVar58._12_4_ = auVar33._28_4_ ^ 0x80000000;
            auVar41 = vpcmpgtq_avx(auVar58,auVar41);
            auVar52._0_8_ = auVar33._0_8_ ^ 0x8000000000000000;
            auVar52._8_4_ = auVar33._8_4_;
            auVar52._12_4_ = auVar33._12_4_ ^ 0x80000000;
            auVar50 = vpcmpgtq_avx(auVar52,auVar27);
            auVar41 = vpackssdw_avx(auVar50,auVar41);
            auVar41 = vpackssdw_avx(auVar41 ^ auVar22,auVar56 ^ auVar22);
            auVar56 = vpmovsxwd_avx(auVar41);
            auVar50 = vpunpckhwd_avx(auVar41,auVar41);
            auVar54._16_16_ = auVar50;
            auVar54._0_16_ = auVar56;
            auVar5 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])(*pauVar18 + uVar11 * 4));
            auVar33 = vcmpps_avx(auVar5,ZEXT1632(auVar36),1);
            auVar33 = vandps_avx(auVar33,auVar28);
            auVar56 = vpackusdw_avx(auVar33._0_16_,auVar33._16_16_);
            auVar41 = vpand_avx(auVar41,auVar56);
            auVar56 = vpmovzxwd_avx(auVar41);
            auVar56 = vpslld_avx(auVar56,0x1f);
            auVar41 = vpunpckhwd_avx(auVar41,auVar41);
            auVar41 = vpslld_avx(auVar41,0x1f);
            auVar47._16_16_ = auVar41;
            auVar47._0_16_ = auVar56;
            auVar6._4_4_ = auVar5._4_4_ * auVar44._4_4_;
            auVar6._0_4_ = auVar5._0_4_ * auVar44._0_4_;
            auVar6._8_4_ = auVar5._8_4_ * auVar44._8_4_;
            auVar6._12_4_ = auVar5._12_4_ * auVar44._12_4_;
            auVar6._16_4_ = auVar5._16_4_ * auVar44._0_4_;
            auVar6._20_4_ = auVar5._20_4_ * auVar44._4_4_;
            auVar6._24_4_ = auVar5._24_4_ * auVar44._8_4_;
            auVar6._28_4_ = auVar5._28_4_;
            auVar33 = vmaskmovps_avx(auVar47,auVar6);
            *(undefined1 (*) [32])(*pauVar18 + uVar11 * 4) = auVar33;
            uVar11 = uVar11 + 8;
          } while ((uVar8 + 8 & 0x1fffffff8) != uVar11);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar19);
    }
  }
  else if (iVar9 == 1) {
    iVar14 = iVar14 * iVar15;
    pauVar18 = (undefined1 (*) [32])bottom_top_blob->data;
    puVar2 = (uint *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      uVar19 = *puVar2;
      iVar9 = iVar14 + 7;
      if (-1 < iVar14) {
        iVar9 = iVar14;
      }
      uVar13 = iVar9 >> 3;
      if (7 < iVar14) {
        auVar22 = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
        auVar23._16_16_ = auVar22;
        auVar23._0_16_ = auVar22;
        uVar20 = (ulong)uVar13;
        pauVar21 = pauVar18;
        do {
          auVar4 = vmaxps_avx(*pauVar21,ZEXT1632(ZEXT816(0) << 0x40));
          auVar33 = vminps_avx(*pauVar21,ZEXT1632(ZEXT816(0) << 0x40));
          auVar22 = vfmadd213ps_fma(auVar33,auVar23,auVar4);
          *pauVar21 = ZEXT1632(auVar22);
          pauVar21 = pauVar21 + 1;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      iVar15 = iVar14 + uVar13 * -8;
      iVar9 = iVar15 + 3;
      if (-1 < iVar15) {
        iVar9 = iVar15;
      }
      auVar22 = ZEXT416(uVar19);
      if (3 < iVar15) {
        auVar36 = vshufps_avx(auVar22,auVar22,0);
        uVar20 = (ulong)(uint)(iVar9 >> 2);
        pauVar17 = (undefined1 (*) [16])(*pauVar18 + (long)(int)(uVar13 * 8) * 4);
        do {
          auVar25 = vmaxps_avx(*pauVar17,ZEXT816(0) << 0x40);
          auVar24 = vminps_avx(*pauVar17,ZEXT816(0) << 0x40);
          auVar25 = vfmadd213ps_fma(auVar24,auVar36,auVar25);
          *pauVar17 = auVar25;
          pauVar17 = pauVar17 + 1;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      auVar4 = _DAT_005f08a0;
      auVar23 = _DAT_005f0880;
      iVar9 = uVar13 * 8 + (iVar9 >> 2) * 4;
      if (iVar9 < iVar14) {
        lVar16 = (long)iVar9;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = (iVar14 - lVar16) - 1;
        auVar36 = vpshufd_avx(auVar36,0x44);
        auVar25 = vshufps_avx(auVar22,auVar22,0);
        uVar8 = 0;
        uVar20 = auVar36._0_8_;
        auVar24._0_8_ = uVar20 ^ 0x8000000000000000;
        auVar24._8_4_ = auVar36._8_4_;
        uVar19 = auVar36._12_4_;
        auVar24._12_4_ = uVar19 ^ 0x80000000;
        auVar27._0_8_ = uVar20 ^ 0x8000000000000000;
        auVar27._8_4_ = auVar24._8_4_;
        auVar27._12_4_ = uVar19 ^ 0x80000000;
        auVar22 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        auVar30._0_8_ = uVar20 ^ 0x8000000000000000;
        auVar30._8_4_ = auVar24._8_4_;
        auVar30._12_4_ = uVar19 ^ 0x80000000;
        auVar33._8_4_ = 0xffff;
        auVar33._0_8_ = 0xffff0000ffff;
        auVar33._12_4_ = 0xffff;
        auVar33._16_4_ = 0xffff;
        auVar33._20_4_ = 0xffff;
        auVar33._24_4_ = 0xffff;
        auVar33._28_4_ = 0xffff;
        do {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar8;
          auVar36 = vpshufd_avx(auVar44,0x44);
          auVar37._16_16_ = auVar36;
          auVar37._0_16_ = auVar36;
          auVar5 = vorps_avx(auVar37,auVar23);
          auVar37 = vorps_avx(auVar37,auVar4);
          auVar50._0_8_ = auVar37._16_8_ ^ 0x8000000000000000;
          auVar50._8_4_ = auVar37._24_4_;
          auVar50._12_4_ = auVar37._28_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar50,auVar24);
          auVar41._0_8_ = auVar37._0_8_ ^ 0x8000000000000000;
          auVar41._8_4_ = auVar37._8_4_;
          auVar41._12_4_ = auVar37._12_4_ ^ 0x80000000;
          auVar44 = vpcmpgtq_avx(auVar41,auVar27);
          auVar36 = vpackssdw_avx(auVar44,auVar36);
          auVar51._0_8_ = auVar5._16_8_ ^ 0x8000000000000000;
          auVar51._8_4_ = auVar5._24_4_;
          auVar51._12_4_ = auVar5._28_4_ ^ 0x80000000;
          auVar44 = vpcmpgtq_avx(auVar51,auVar24);
          auVar56._0_8_ = auVar5._0_8_ ^ 0x8000000000000000;
          auVar56._8_4_ = auVar5._8_4_;
          auVar56._12_4_ = auVar5._12_4_ ^ 0x80000000;
          auVar41 = vpcmpgtq_avx(auVar56,auVar30);
          auVar44 = vpackssdw_avx(auVar41,auVar44);
          auVar36 = vpackssdw_avx(auVar44 ^ auVar22,auVar36 ^ auVar22);
          auVar44 = vpmovsxwd_avx(auVar36);
          auVar41 = vpunpckhwd_avx(auVar36,auVar36);
          auVar45._16_16_ = auVar41;
          auVar45._0_16_ = auVar44;
          auVar37 = vmaskmovps_avx(auVar45,*(undefined1 (*) [32])
                                            (*pauVar18 + uVar8 * 4 + lVar16 * 4));
          auVar5 = vcmpps_avx(auVar37,ZEXT1632(ZEXT816(0) << 0x40),1);
          auVar5 = vandps_avx(auVar5,auVar33);
          auVar44 = vpackusdw_avx(auVar5._0_16_,auVar5._16_16_);
          auVar36 = vpand_avx(auVar36,auVar44);
          auVar44 = vpmovzxwd_avx(auVar36);
          auVar44 = vpslld_avx(auVar44,0x1f);
          auVar36 = vpunpckhwd_avx(auVar36,auVar36);
          auVar36 = vpslld_avx(auVar36,0x1f);
          auVar38._16_16_ = auVar36;
          auVar38._0_16_ = auVar44;
          auVar5._4_4_ = auVar37._4_4_ * auVar25._4_4_;
          auVar5._0_4_ = auVar37._0_4_ * auVar25._0_4_;
          auVar5._8_4_ = auVar37._8_4_ * auVar25._8_4_;
          auVar5._12_4_ = auVar37._12_4_ * auVar25._12_4_;
          auVar5._16_4_ = auVar37._16_4_ * auVar25._0_4_;
          auVar5._20_4_ = auVar37._20_4_ * auVar25._4_4_;
          auVar5._24_4_ = auVar37._24_4_ * auVar25._8_4_;
          auVar5._28_4_ = auVar37._28_4_;
          auVar5 = vmaskmovps_avx(auVar38,auVar5);
          *(undefined1 (*) [32])(*pauVar18 + uVar8 * 4 + lVar16 * 4) = auVar5;
          uVar8 = uVar8 + 8;
        } while (((iVar14 - lVar16) + 7U & 0xfffffffffffffff8) != uVar8);
      }
    }
    else {
      iVar9 = iVar14 + 7;
      if (-1 < iVar14) {
        iVar9 = iVar14;
      }
      uVar19 = iVar9 >> 3;
      if (7 < iVar14) {
        uVar20 = (ulong)uVar19;
        lVar16 = 0;
        do {
          auVar23 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar18 + lVar16),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar4 = vminps_avx(*(undefined1 (*) [32])(*pauVar18 + lVar16),
                              ZEXT1632(ZEXT816(0) << 0x40));
          auVar22 = vfmadd132ps_fma(auVar4,auVar23,*(undefined1 (*) [32])((long)puVar2 + lVar16));
          *(undefined1 (*) [32])(*pauVar18 + lVar16) = ZEXT1632(auVar22);
          lVar16 = lVar16 + 0x20;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      iVar15 = iVar14 + uVar19 * -8;
      iVar9 = iVar15 + 3;
      if (-1 < iVar15) {
        iVar9 = iVar15;
      }
      uVar20 = (ulong)(uint)(iVar9 >> 2);
      if (3 < iVar15) {
        lVar16 = (long)(int)(uVar19 * 8) << 2;
        do {
          auVar22 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar18 + lVar16),ZEXT816(0) << 0x40);
          auVar36 = vminps_avx(*(undefined1 (*) [16])(*pauVar18 + lVar16),ZEXT816(0) << 0x40);
          auVar22 = vfmadd132ps_fma(auVar36,auVar22,*(undefined1 (*) [16])((long)puVar2 + lVar16));
          *(undefined1 (*) [16])(*pauVar18 + lVar16) = auVar22;
          lVar16 = lVar16 + 0x10;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      iVar9 = uVar19 * 8 + (iVar9 >> 2) * 4;
      if (iVar9 < iVar14) {
        pvVar3 = (this->super_PReLU).slope_data.data;
        lVar16 = (long)iVar9;
        do {
          if (*(float *)(*pauVar18 + lVar16 * 4) < 0.0) {
            *(float *)(*pauVar18 + lVar16 * 4) =
                 *(float *)(*pauVar18 + lVar16 * 4) * *(float *)((long)pvVar3 + lVar16 * 4);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < iVar14);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}